

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockAgent.h
# Opt level: O3

void __thiscall
jaegertracing::testutils::MockAgent::
addSamplingStrategy<char_const(&)[13],jaegertracing::sampling_manager::thrift::SamplingStrategyResponse&>
          (MockAgent *this,char (*args) [13],SamplingStrategyResponse *args_1)

{
  size_t sVar1;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  sVar1 = strlen(*args);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,args,*args + sVar1);
  SamplingManager::addSamplingStrategy((SamplingManager *)(this + 0x168),&local_48,args_1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return;
}

Assistant:

void addSamplingStrategy(Args&&... args)
    {
        _samplingMgr.addSamplingStrategy(std::forward<Args>(args)...);
    }